

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# python_generator.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::python::Generator::FixOptionsForEnum
          (Generator *this,EnumDescriptor *enum_descriptor)

{
  long lVar1;
  bool bVar2;
  long lVar3;
  allocator<char> local_e9;
  Generator *local_e8;
  long local_e0;
  EnumDescriptor *local_d8;
  string local_d0;
  string value_options;
  string enum_options;
  string descriptor_name;
  string local_50;
  
  local_e8 = this;
  ModuleLevelDescriptorName<google::protobuf::EnumDescriptor>(&descriptor_name,this,enum_descriptor)
  ;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&value_options,"EnumOptions",(allocator<char> *)&local_50);
  MessageLite::SerializeAsString_abi_cxx11_(&local_d0,*(MessageLite **)(enum_descriptor + 0x20));
  OptionsValue(&enum_options,local_e8,&value_options,&local_d0);
  std::__cxx11::string::~string((string *)&local_d0);
  std::__cxx11::string::~string((string *)&value_options);
  bVar2 = std::operator!=(&enum_options,"None");
  if (bVar2) {
    anon_unknown_0::PrintDescriptorOptionsFixingCode
              (&descriptor_name,&enum_options,local_e8->printer_);
  }
  local_e0 = 0x20;
  local_d8 = enum_descriptor;
  for (lVar3 = 0; lVar3 < *(int *)(local_d8 + 0x2c); lVar3 = lVar3 + 1) {
    lVar1 = *(long *)(local_d8 + 0x30);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_d0,"EnumValueOptions",&local_e9);
    MessageLite::SerializeAsString_abi_cxx11_(&local_50,*(MessageLite **)(lVar1 + local_e0));
    OptionsValue(&value_options,local_e8,&local_d0,&local_50);
    std::__cxx11::string::~string((string *)&local_50);
    std::__cxx11::string::~string((string *)&local_d0);
    bVar2 = std::operator!=(&value_options,"None");
    if (bVar2) {
      StringPrintf_abi_cxx11_
                (&local_d0,"%s.values_by_name[\"%s\"]",descriptor_name._M_dataplus._M_p,
                 **(undefined8 **)(lVar1 + -0x20 + local_e0));
      anon_unknown_0::PrintDescriptorOptionsFixingCode(&local_d0,&value_options,local_e8->printer_);
      std::__cxx11::string::~string((string *)&local_d0);
    }
    std::__cxx11::string::~string((string *)&value_options);
    local_e0 = local_e0 + 0x28;
  }
  std::__cxx11::string::~string((string *)&enum_options);
  std::__cxx11::string::~string((string *)&descriptor_name);
  return;
}

Assistant:

void Generator::FixOptionsForEnum(const EnumDescriptor& enum_descriptor) const {
  string descriptor_name = ModuleLevelDescriptorName(enum_descriptor);
  string enum_options = OptionsValue(
      "EnumOptions", enum_descriptor.options().SerializeAsString());
  if (enum_options != "None") {
    PrintDescriptorOptionsFixingCode(descriptor_name, enum_options, printer_);
  }
  for (int i = 0; i < enum_descriptor.value_count(); ++i) {
    const EnumValueDescriptor& value_descriptor = *enum_descriptor.value(i);
    string value_options = OptionsValue(
        "EnumValueOptions", value_descriptor.options().SerializeAsString());
    if (value_options != "None") {
      PrintDescriptorOptionsFixingCode(
          StringPrintf("%s.values_by_name[\"%s\"]", descriptor_name.c_str(),
                       value_descriptor.name().c_str()),
          value_options, printer_);
    }
  }
}